

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder1_.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  double __x;
  int one;
  double wa [30];
  double fjac [45];
  double fvec [15];
  double x [3];
  double fnorm;
  double tol;
  int ipvt [3];
  int lwa;
  int info;
  int ldfjac;
  int n;
  int m;
  int j;
  int local_34c [13];
  double *in_stack_fffffffffffffce8;
  int *in_stack_fffffffffffffcf0;
  double *in_stack_fffffffffffffd88;
  double *in_stack_fffffffffffffd90;
  double *in_stack_fffffffffffffd98;
  int *in_stack_fffffffffffffda0;
  int *in_stack_fffffffffffffda8;
  minpack_funcder_mn in_stack_fffffffffffffdb0;
  int *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  int *in_stack_fffffffffffffe08;
  double *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe18;
  double local_68 [4];
  double local_48;
  undefined4 local_34;
  uint local_30;
  undefined4 local_2c;
  int local_28;
  undefined4 local_24;
  int local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  local_34c[0] = 1;
  local_24 = 0xf;
  local_28 = 3;
  local_68[0] = 1.0;
  local_68[1] = 1.0;
  local_68[2] = 1.0;
  local_2c = 0xf;
  local_34 = 0x1e;
  __x = dpmpar_(local_34c);
  local_48 = sqrt(__x);
  lmder1_(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
          in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
          in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,
          in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18);
  local_68[3] = enorm_(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  printf("      final l2 norm of the residuals%15.7g\n\n",local_68[3]);
  printf("      exit parameter                %10i\n\n",(ulong)local_30);
  printf("      final approximate solution\n");
  for (local_20 = 1; local_20 <= local_28; local_20 = local_20 + 1) {
    pcVar1 = "";
    if (local_20 % 3 == 1) {
      pcVar1 = "\n     ";
    }
    printf("%s%15.7g",local_68[local_20 + -1],pcVar1);
  }
  printf("\n");
  return 0;
}

Assistant:

int main()
{
  int j, m, n, ldfjac, info, lwa;
  int ipvt[3];
  real tol, fnorm;
  real x[3], fvec[15], fjac[15*3], wa[30];
  int one=1;

  m = 15;
  n = 3;

/*      the following starting values provide a rough fit. */

  x[1-1] = 1.;
  x[2-1] = 1.;
  x[3-1] = 1.;

  ldfjac = 15;
  lwa = 30;

/*      set tol to the square root of the machine precision. */
/*      unless high solutions are required, */
/*      this is the recommended setting. */

  tol = sqrt(__minpack_func__(dpmpar)(&one));

  __minpack_func__(lmder1)(&fcn, &m, &n, x, fvec, fjac, &ldfjac, &tol, 
	  &info, ipvt, wa, &lwa);
  fnorm = __minpack_func__(enorm)(&m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=1; j<=n; j++) {
    printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
  }
  printf("\n");

  return 0;
}